

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O1

ClauseIterator __thiscall
Inferences::PrimitiveInstantiation::generateClauses(PrimitiveInstantiation *this,Clause *premise)

{
  long *plVar1;
  FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
  *pFVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  OptionBaseRef<Kernel::Literal_**> OVar5;
  bool bVar6;
  _func_int **pp_Var7;
  ResultFn f;
  Value in_RDX;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
  it4;
  FlatMapIter<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65)>_>,_Inferences::PrimitiveInstantiation::IsInstantiable>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
  it3;
  uint local_128;
  uint uStack_124;
  undefined1 local_108 [40];
  OptionBaseRef<Kernel::Literal_**> local_e0;
  OptionBaseRef<Kernel::Literal_**> local_d8;
  bool local_d0;
  Value local_c8;
  PrimitiveInstantiationIndex *local_b8 [2];
  Clause *local_a8;
  RangeIterator<unsigned_int> RStack_a0;
  undefined4 uStack_94;
  OptionBaseRef<Kernel::Literal_**> OStack_90;
  char local_88;
  Value local_80;
  Clause *local_78;
  PrimitiveInstantiationIndex *pPStack_70;
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  local_68;
  
  local_108._32_4_ = *(uint *)((long)in_RDX + 0x3c) & 0xfffff;
  f._cl = *(Clause **)&(premise->super_Unit)._inference.field_0x8;
  local_108._24_8_ = (Clause *)0x0;
  local_e0._elem = (Literal **)0x0;
  local_108._0_8_ = f._cl;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  ::FlatteningIterator
            (&local_68,
             (MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
              *)local_108);
  local_b8[0] = local_68._master._func._index;
  local_a8 = local_68._master._inner._inn._iter._func.a;
  RStack_a0._next = local_68._master._inner._inn._iter._inner._next;
  RStack_a0._from = local_68._master._inner._inn._iter._inner._from;
  RStack_a0._to = local_68._master._inner._inn._iter._inner._to;
  uStack_94 = local_68._master._inner._inn._iter._20_4_;
  OStack_90._elem =
       (Literal **)
       local_68._master._inner._next.super_OptionBase<Kernel::Literal_*&>.
       super_OptionBaseRef<Kernel::Literal_**>._elem;
  local_88 = local_68._current.
             super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
             ._isSome;
  if (local_68._current.
      super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
      ._isSome == true) {
    local_80 = local_68._current.
               super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
               ._elem._elem;
    if (local_68._current.
        super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
        ._elem._elem != (Value)0x0) {
      *(int *)((long)local_68._current.
                     super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
                     ._elem._elem + 8) =
           *(int *)((long)local_68._current.
                          super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
                          ._elem._elem + 8) + 1;
    }
  }
  ::Lib::
  getMappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::PrimitiveInstantiation::IsInstantiable,false>,Inferences::PrimitiveInstantiation::ApplicableRewritesFn,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>>,Inferences::PrimitiveInstantiation::ResultFn>
            ((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>,_Inferences::PrimitiveInstantiation::ResultFn,_Kernel::Clause_*>
              *)local_108,(Lib *)local_b8,
             (FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
              *)in_RDX,f);
  if ((local_88 == '\x01') && (local_80 != (Value)0x0)) {
    plVar1 = (long *)((long)local_80 + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  bVar6 = local_d0;
  OVar5._elem = local_e0._elem;
  uVar4 = local_108._32_4_;
  uVar3 = local_108._24_8_;
  local_78 = (Clause *)local_108._0_8_;
  pPStack_70 = (PrimitiveInstantiationIndex *)local_108._8_8_;
  if ((local_d0 == true) && (in_RDX = local_c8, local_c8 != (Value)0x0)) {
    *(int *)((long)local_c8 + 8) = *(int *)((long)local_c8 + 8) + 1;
  }
  pp_Var7 = (_func_int **)::operator_new(0x58,8);
  if (in_RDX != (Value)0x0 && (bVar6 ^ 1U) == 0) {
    *(int *)((long)in_RDX + 8) = *(int *)((long)in_RDX + 8) + 1;
  }
  *(undefined4 *)(pp_Var7 + 1) = 0;
  *pp_Var7 = (_func_int *)&PTR__ProxyIterator_00b664a8;
  pp_Var7[2] = (_func_int *)local_78;
  pp_Var7[3] = (_func_int *)pPStack_70;
  local_128 = (uint)uVar3;
  uStack_124 = SUB84(uVar3,4);
  *(uint *)(pp_Var7 + 5) = local_128;
  *(uint *)((long)pp_Var7 + 0x2c) = uStack_124;
  *(undefined4 *)(pp_Var7 + 6) = uVar4;
  *(undefined4 *)((long)pp_Var7 + 0x34) = local_108._36_4_;
  ((OptionBaseRef<Kernel::Literal_**> *)(pp_Var7 + 7))->_elem = OVar5._elem;
  ((OptionBaseRef<Kernel::Literal_**> *)(pp_Var7 + 8))->_elem = local_d8._elem;
  *(bool *)(pp_Var7 + 9) = bVar6;
  if (bVar6 == false) {
    (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
    super_InferenceEngine._vptr_InferenceEngine = pp_Var7;
    *(undefined4 *)(pp_Var7 + 1) = 1;
  }
  else {
    *(Value *)(pp_Var7 + 10) = in_RDX;
    if (in_RDX != (Value)0x0) {
      *(int *)((long)in_RDX + 8) = *(int *)((long)in_RDX + 8) + 1;
    }
    (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
    super_InferenceEngine._vptr_InferenceEngine = pp_Var7;
    *(int *)(pp_Var7 + 1) = *(int *)(pp_Var7 + 1) + 1;
    if (in_RDX != (Value)0x0) {
      pFVar2 = (FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
                *)((long)in_RDX + 8);
      *(int *)pFVar2 = *(int *)pFVar2 + -1;
      if (*(int *)pFVar2 == 0) {
        (**(code **)(*(long *)in_RDX + 8))(in_RDX);
      }
    }
  }
  if (in_RDX != (Value)0x0 && (bVar6 ^ 1U) == 0) {
    pFVar2 = (FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
              *)((long)in_RDX + 8);
    *(int *)pFVar2 = *(int *)pFVar2 + -1;
    if (*(int *)pFVar2 == 0) {
      (**(code **)(*(long *)in_RDX + 8))(in_RDX);
    }
  }
  if ((local_d0 == true) && (local_c8 != (Value)0x0)) {
    pFVar2 = (FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>
              *)((long)local_c8 + 8);
    *(int *)pFVar2 = *(int *)pFVar2 + -1;
    if (*(int *)pFVar2 == 0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((local_68._current.
       super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
       ._isSome == true) &&
     (local_68._current.
      super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar1 = (long *)((long)local_68._current.
                            super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
                            ._elem._elem + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_68._current.
                            super_OptionBase<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
                            ._elem._elem + 8))();
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator PrimitiveInstantiation::generateClauses(Clause* premise)
{
  //is this correct?
  auto it1 = premise->getSelectedLiteralIterator();
  //filter out literals that are not suitable for narrowing
  auto it2 = getFilteredIterator(it1, IsInstantiable());

  //pair of literals and possible rewrites that can be applied to literals
  auto it3 = getMapAndFlattenIterator(it2, ApplicableRewritesFn(_index));
  
  //apply rewrite rules to literals
  auto it4 = getMappingIterator(it3, ResultFn(premise));
  

  return pvi( it4 );

}